

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O0

void icu_63::ures_enumDependencies
               (char *itemName,UDataInfo *pInfo,uint8_t *inBytes,int32_t length,
               CheckDependency *check,void *context,Package *pkg,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t idx;
  Item *item;
  UDataInfo *pUVar2;
  uint8_t *puVar3;
  int32_t poolIndexLength;
  int32_t *poolIndexes;
  int32_t *poolRoot;
  UDataInfo *poolInfo;
  int32_t index;
  char local_168 [8];
  char poolName [200];
  NativeItem nativePool;
  ResourceData resData;
  void *context_local;
  CheckDependency *check_local;
  int32_t length_local;
  uint8_t *inBytes_local;
  UDataInfo *pInfo_local;
  char *itemName_local;
  
  res_read_63((ResourceData *)&nativePool.length,pInfo,inBytes,length,pErrorCode);
  UVar1 = ::U_FAILURE(*pErrorCode);
  if (UVar1 != '\0') {
    fprintf(_stderr,"icupkg: .res format version %02x.%02x not supported, or bundle malformed\n",
            (ulong)pInfo->formatVersion[0],(ulong)pInfo->formatVersion[1]);
    exit(0x10);
  }
  if (((1 < pInfo->formatVersion[0]) ||
      ((pInfo->formatVersion[0] == '\x01' && (pInfo->formatVersion[1] != '\0')))) &&
     ((char)resData.poolStringIndexLimit == '\0')) {
    checkParent(itemName,check,context,pErrorCode);
  }
  NativeItem::NativeItem((NativeItem *)(poolName + 0xc0));
  if (resData.poolStringIndexLimit._2_1_ != '\0') {
    makeTargetName(itemName,"pool",4,".res",local_168,200,pErrorCode);
    UVar1 = ::U_FAILURE(*pErrorCode);
    if (UVar1 != '\0') goto LAB_0020bfb5;
    (*check)(context,itemName,local_168);
    idx = Package::findItem(pkg,local_168,-1);
    if (idx < 0) goto LAB_0020bfb5;
    item = Package::getItem(pkg,idx);
    NativeItem::setItem((NativeItem *)(poolName + 0xc0),item,ures_swap_63);
    pUVar2 = NativeItem::getDataInfo((NativeItem *)(poolName + 0xc0));
    if (pUVar2->formatVersion[0] < 2) {
      fprintf(_stderr,"icupkg: %s is not a pool bundle\n",local_168);
      goto LAB_0020bfb5;
    }
    puVar3 = NativeItem::getBytes((NativeItem *)(poolName + 0xc0));
    if (((*(uint *)(puVar3 + 4) & 0xff) < 8) || ((*(uint *)(puVar3 + 0x18) & 2) == 0)) {
      fprintf(_stderr,"icupkg: %s is not a pool bundle\n",local_168);
      goto LAB_0020bfb5;
    }
    if (*(int *)&(resData.data)->mapAddr != *(int *)(puVar3 + 0x20)) {
      fprintf(_stderr,"icupkg: %s has mismatched checksum for %s\n",local_168,itemName);
      goto LAB_0020bfb5;
    }
  }
  ures_enumDependencies
            (itemName,(ResourceData *)&nativePool.length,(Resource)resData.poolBundleKeys,
             (char *)0x0,(char *)0x0,0,check,context,pkg,pErrorCode);
LAB_0020bfb5:
  NativeItem::~NativeItem((NativeItem *)(poolName + 0xc0));
  return;
}

Assistant:

static void
ures_enumDependencies(const char *itemName, const UDataInfo *pInfo,
                      const uint8_t *inBytes, int32_t length,
                      CheckDependency check, void *context,
                      Package *pkg,
                      UErrorCode *pErrorCode) {
    ResourceData resData;

    res_read(&resData, pInfo, inBytes, length, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "icupkg: .res format version %02x.%02x not supported, or bundle malformed\n",
                        pInfo->formatVersion[0], pInfo->formatVersion[1]);
        exit(U_UNSUPPORTED_ERROR);
    }

    /*
     * if the bundle attributes are present and the nofallback flag is not set,
     * then add the parent bundle as a dependency
     */
    if(pInfo->formatVersion[0]>1 || (pInfo->formatVersion[0]==1 && pInfo->formatVersion[1]>=1)) {
        if(!resData.noFallback) {
            /* this bundle participates in locale fallback */
            checkParent(itemName, check, context, pErrorCode);
        }
    }

    icu::NativeItem nativePool;

    if(resData.usesPoolBundle) {
        char poolName[200];
        makeTargetName(itemName, "pool", 4, ".res", poolName, (int32_t)sizeof(poolName), pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            return;
        }
        check(context, itemName, poolName);
        int32_t index=pkg->findItem(poolName);
        if(index<0) {
            // We cannot work with a bundle if its pool resource is missing.
            // check() already printed a complaint.
            return;
        }
        // TODO: Cache the native version in the Item itself.
        nativePool.setItem(pkg->getItem(index), ures_swap);
        const UDataInfo *poolInfo=nativePool.getDataInfo();
        if(poolInfo->formatVersion[0]<=1) {
            fprintf(stderr, "icupkg: %s is not a pool bundle\n", poolName);
            return;
        }
        const int32_t *poolRoot=(const int32_t *)nativePool.getBytes();
        const int32_t *poolIndexes=poolRoot+1;
        int32_t poolIndexLength=poolIndexes[URES_INDEX_LENGTH]&0xff;
        if(!(poolIndexLength>URES_INDEX_POOL_CHECKSUM &&
             (poolIndexes[URES_INDEX_ATTRIBUTES]&URES_ATT_IS_POOL_BUNDLE))
        ) {
            fprintf(stderr, "icupkg: %s is not a pool bundle\n", poolName);
            return;
        }
        if(resData.pRoot[1+URES_INDEX_POOL_CHECKSUM]==poolIndexes[URES_INDEX_POOL_CHECKSUM]) {
            resData.poolBundleKeys=(const char *)(poolIndexes+poolIndexLength);
            resData.poolBundleStrings=(const uint16_t *)(poolRoot+poolIndexes[URES_INDEX_KEYS_TOP]);
        } else {
            fprintf(stderr, "icupkg: %s has mismatched checksum for %s\n", poolName, itemName);
            return;
        }
    }

    ures_enumDependencies(
        itemName, &resData,
        resData.rootRes, NULL, NULL, 0,
        check, context,
        pkg,
        pErrorCode);
}